

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void __thiscall Overlay_Window::draw(Overlay_Window *this)

{
  byte bVar1;
  Fl_Boxtype FVar2;
  int iVar3;
  Fl_Color c;
  int local_1c;
  int local_18;
  int X;
  int Y;
  int CHECKSIZE;
  Overlay_Window *this_local;
  
  bVar1 = Fl_Widget::damage((Fl_Widget *)this);
  if (((bVar1 & 0x80) != 0) &&
     ((FVar2 = Fl_Widget::box((Fl_Widget *)this), FVar2 == FL_NO_BOX ||
      (((FVar2 = Fl_Widget::box((Fl_Widget *)this), 3 < (int)FVar2 &&
        (FVar2 = Fl_Widget::box((Fl_Widget *)this), (FVar2 & FL_UP_BOX) == FL_NO_BOX)) ||
       (FVar2 = Fl_Widget::box((Fl_Widget *)this), 0x11 < (int)FVar2)))))) {
    for (local_18 = 0; iVar3 = Fl_Widget::h((Fl_Widget *)this), local_18 < iVar3;
        local_18 = local_18 + 8) {
      for (local_1c = 0; iVar3 = Fl_Widget::w((Fl_Widget *)this), local_1c < iVar3;
          local_1c = local_1c + 8) {
        c = 0x38;
        if ((local_18 / 0x10 & 1U) != (local_1c / 0x10 & 1U)) {
          c = 0xff;
        }
        fl_color(c);
        fl_rectf(local_1c,local_18,8,8);
      }
    }
  }
  Fl_Window::draw((Fl_Window *)this);
  return;
}

Assistant:

void Overlay_Window::draw() {
  const int CHECKSIZE = 8;
  // see if box is clear or a frame or rounded:
  if ((damage()&FL_DAMAGE_ALL) &&
      (!box() || (box()>=4&&!(box()&2)) || box()>=_FL_ROUNDED_BOX)) {
    // if so, draw checkerboard so user can see what areas are clear:
    for (int Y = 0; Y < h(); Y += CHECKSIZE) 
      for (int X = 0; X < w(); X += CHECKSIZE) {
	fl_color(((Y/(2*CHECKSIZE))&1) != ((X/(2*CHECKSIZE))&1) ?
		 FL_WHITE : FL_BLACK);
	fl_rectf(X,Y,CHECKSIZE,CHECKSIZE);
      }
  }
  Fl_Overlay_Window::draw();
}